

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::setupDefaultInputs(TextureQueryLodInstance *this)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  vector<float,_std::allocator<float>_> texCoord;
  Vec4 s;
  Vec4 b;
  Vec4 coords [4];
  Mat4 coordTransMat;
  undefined1 *local_88;
  float afStack_80 [2];
  Matrix<float,_4,_4> local_78;
  
  TextureQueryInstance::setupDefaultInputs(&this->super_TextureQueryInstance);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Matrix<float,_4,_4>::Matrix(&coordTransMat);
  tcu::operator-((tcu *)&s,&this->m_maxCoord,&this->m_minCoord);
  tcu::Vector<float,_4>::Vector(&b,&this->m_minCoord);
  coords[0].m_data[0] = s.m_data[0];
  coords[0].m_data[1] = 0.0;
  coords[0].m_data[2] = 0.0;
  coords[0].m_data[3] = b.m_data[0];
  coords[1].m_data[0] = 0.0;
  coords[1].m_data[1] = s.m_data[1];
  coords[1].m_data[2] = 0.0;
  coords[1].m_data[3] = b.m_data[1];
  coords[2].m_data[0] = s.m_data[2] * 0.5;
  coords[2].m_data[1] = s.m_data[2] * -0.5;
  coords[2].m_data[2] = 0.0;
  coords[2].m_data[3] = coords[2].m_data[0] + b.m_data[2];
  coords[3].m_data[1] = s.m_data[3] * 0.5;
  coords[3].m_data[0] = s.m_data[3] * -0.5;
  coords[3].m_data[2] = 0.0;
  coords[3].m_data[3] = s.m_data[3] * 0.5 + b.m_data[3];
  tcu::Matrix<float,_4,_4>::Matrix(&local_78,coords[0].m_data);
  tcu::Matrix<float,_4,_4>::operator=(&coordTransMat,&local_78);
  uVar2 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
  uVar4 = 0;
  if (uVar2 < 7) {
    uVar4 = *(uint *)(&DAT_009c06bc + uVar2 * 4);
  }
  local_78.m_data.m_data[0].m_data[0] = 0.0;
  local_78.m_data.m_data[0].m_data[1] = 0.0;
  local_78.m_data.m_data[0].m_data[2] = 0.0;
  local_78.m_data.m_data[0].m_data[3] = 1.0;
  tcu::operator*((tcu *)coords,&coordTransMat,(Vector<float,_4> *)&local_78);
  s.m_data[0] = 0.0;
  s.m_data[1] = 1.0;
  s.m_data[2] = 0.0;
  s.m_data[3] = 1.0;
  tcu::operator*((tcu *)(coords + 1),&coordTransMat,&s);
  b.m_data[0] = 1.0;
  b.m_data[1] = 0.0;
  b.m_data[2] = 0.0;
  b.m_data[3] = 1.0;
  tcu::operator*((tcu *)(coords + 2),&coordTransMat,&b);
  local_88 = &DAT_3f8000003f800000;
  afStack_80[0] = 0.0;
  afStack_80[1] = 1.0;
  tcu::operator*((tcu *)(coords + 3),&coordTransMat,(Vector<float,_4> *)&local_88);
  std::vector<float,_std::allocator<float>_>::resize(&texCoord,(ulong)(uVar4 * 4));
  lVar5 = 0;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    memcpy((void *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar5),
           (void *)((long)coords[0].m_data + lVar3),(ulong)(uVar4 * 4));
    lVar5 = lVar5 + (ulong)uVar4 * 4;
  }
  uVar2 = (ulong)((this->super_TextureQueryInstance).m_textureSpec)->type;
  iVar1 = 0;
  if (uVar2 < 7) {
    iVar1 = *(int *)(&DAT_009c06bc + uVar2 * 4);
  }
  ShaderRenderCaseInstance::addAttribute
            ((ShaderRenderCaseInstance *)this,1,
             *(VkFormat *)
              ("N3vkt2sr12_GLOBAL__N_123TextureQueryLodInstanceE" + (long)iVar1 * 4 + 0x30),
             iVar1 << 2,4,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void TextureQueryLodInstance::setupDefaultInputs (void)
{
	TextureQueryInstance::setupDefaultInputs();

	const deUint32			numVertices			= 4;
	const vector<float>		texCoord			= computeQuadTexCoord();
	const int				texCoordComps		= getQueryLodFuncTextCoordComps(m_textureSpec.type);
	const vk::VkFormat		coordFormats[]		=
	{
		vk::VK_FORMAT_R32_SFLOAT,
		vk::VK_FORMAT_R32G32_SFLOAT,
		vk::VK_FORMAT_R32G32B32_SFLOAT
	};

	DE_ASSERT(de::inRange(texCoordComps, 1, 3));
	DE_ASSERT((int)texCoord.size() == texCoordComps * 4);

	addAttribute(1u, coordFormats[texCoordComps - 1], (deUint32)(texCoordComps * sizeof(float)), numVertices, texCoord.data());
}